

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::pp_include(CTcTokenizer *this)

{
  byte bVar1;
  char *p;
  bool bVar2;
  wchar_t wVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  size_t sVar8;
  CTcSrcFile *pCVar9;
  size_t orig_fname_len;
  CTcTokFileDesc *pCVar10;
  CTcTokStream *pCVar11;
  byte *pbVar12;
  CTcTokenizer *this_00;
  byte *pbVar13;
  byte *pbVar14;
  tctok_incpath_t *ptVar15;
  CTcTokStream *pCVar16;
  tctok_incfile_t *ptVar17;
  bool bVar18;
  int default_charset_error;
  char full_name [4096];
  int charset_error;
  char lcl_name [4096];
  int local_303c;
  byte local_3038 [4096];
  byte local_2038 [4096];
  char local_1038 [4104];
  
  p = (this->p_).p_;
  wVar3 = utf8_ptr::s_getch(p);
  while (((uint)wVar3 < 0x80 && (iVar4 = isspace(wVar3), iVar4 != 0))) {
    pbVar12 = (byte *)(this->p_).p_;
    bVar1 = *pbVar12;
    pbVar12 = pbVar12 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
    (this->p_).p_ = (char *)pbVar12;
    wVar3 = utf8_ptr::s_getch((char *)pbVar12);
  }
  wVar3 = utf8_ptr::s_getch((this->p_).p_);
  if (wVar3 == L'<') {
    wVar3 = L'>';
LAB_002208b5:
    pbVar12 = (byte *)(this->p_).p_;
    bVar1 = *pbVar12;
    pbVar12 = pbVar12 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3);
    while( true ) {
      (this->p_).p_ = (char *)(pbVar12 + 1);
      wVar5 = utf8_ptr::s_getch((char *)(pbVar12 + 1));
      if ((wVar5 == L'\0') || (wVar5 = utf8_ptr::s_getch((this->p_).p_), wVar5 == wVar3)) break;
      pbVar12 = (byte *)(this->p_).p_;
      bVar1 = *pbVar12;
      pbVar12 = pbVar12 + (((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3);
    }
    wVar5 = utf8_ptr::s_getch((this->p_).p_);
    if (wVar5 != wVar3) goto LAB_002209c9;
    pbVar12 = (byte *)(this->p_).p_;
    bVar1 = *pbVar12;
    pbVar12 = pbVar12 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
    (this->p_).p_ = (char *)pbVar12;
    wVar3 = utf8_ptr::s_getch((char *)pbVar12);
    while (((uint)wVar3 < 0x80 && (iVar4 = isspace(wVar3), iVar4 != 0))) {
      pbVar12 = (byte *)(this->p_).p_;
      bVar1 = *pbVar12;
      pbVar12 = pbVar12 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      (this->p_).p_ = (char *)pbVar12;
      wVar3 = utf8_ptr::s_getch((char *)pbVar12);
    }
    wVar3 = utf8_ptr::s_getch((this->p_).p_);
    (this->p_).p_ = p;
    if (wVar3 != L'\0') goto LAB_002209d0;
  }
  else {
    if (wVar3 == L'\"') {
      wVar3 = L'\"';
      goto LAB_002208b5;
    }
LAB_002209c9:
    (this->p_).p_ = p;
LAB_002209d0:
    this_00 = this;
    iVar4 = expand_macros_curline(this,0,0,0);
    if (iVar4 != 0) goto LAB_00220dc7;
    remove_expansion_flags(this_00,&this->expbuf_);
    this->curbuf_ = &this->expbuf_;
    (this->p_).p_ = (this->expbuf_).buf_;
  }
  wVar3 = utf8_ptr::s_getch((this->p_).p_);
  while (((uint)wVar3 < 0x80 && (iVar4 = isspace(wVar3), iVar4 != 0))) {
    pbVar12 = (byte *)(this->p_).p_;
    bVar1 = *pbVar12;
    pbVar12 = pbVar12 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
    (this->p_).p_ = (char *)pbVar12;
    wVar3 = utf8_ptr::s_getch((char *)pbVar12);
  }
  wVar3 = utf8_ptr::s_getch((this->p_).p_);
  wVar5 = L'\"';
  if (wVar3 == L'\"') {
LAB_00220a94:
    pbVar12 = (byte *)(this->p_).p_;
    bVar1 = *pbVar12;
    pbVar12 = pbVar12 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
    (this->p_).p_ = (char *)pbVar12;
    pbVar13 = pbVar12;
    while ((wVar6 = utf8_ptr::s_getch((char *)pbVar13), wVar6 != L'\0' &&
           (wVar6 = utf8_ptr::s_getch((this->p_).p_), wVar6 != wVar5))) {
      pbVar13 = (byte *)(this->p_).p_;
      bVar1 = *pbVar13;
      pbVar13 = pbVar13 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
      (this->p_).p_ = (char *)pbVar13;
    }
    wVar5 = utf8_ptr::s_getch((this->p_).p_);
    if (wVar5 != L'\0') {
      pbVar13 = (byte *)(this->p_).p_;
      bVar1 = *pbVar13;
      (this->p_).p_ =
           (char *)(pbVar13 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1);
      wVar5 = utf8_ptr::s_getch((char *)(pbVar13 +
                                        (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3
                                               ) + 1));
      while (((uint)wVar5 < 0x80 && (iVar4 = isspace(wVar5), iVar4 != 0))) {
        pbVar14 = (byte *)(this->p_).p_;
        bVar1 = *pbVar14;
        pbVar14 = pbVar14 + (ulong)(((bVar1 >> 5 & 1) != 0) + 1 & (uint)(bVar1 >> 7) * 3) + 1;
        (this->p_).p_ = (char *)pbVar14;
        wVar5 = utf8_ptr::s_getch((char *)pbVar14);
      }
      wVar5 = utf8_ptr::s_getch((this->p_).p_);
      if (wVar5 != L'\0') {
        log_warning(0x274c);
      }
      *pbVar13 = 0;
      iVar4 = os_is_file_absolute((char *)pbVar12);
      os_cvt_url_dir(local_1038,0x1000,(char *)pbVar12);
      if (((wVar3 == L'\"') && (this->last_desc_ != (CTcTokFileDesc *)0x0)) &&
         (pCVar16 = this->str_, pCVar16 != (CTcTokStream *)0x0)) {
        do {
          os_get_path_name((char *)local_2038,0x1000,this->last_desc_->fname_);
          os_build_full_path((char *)local_3038,0x1000,(char *)local_2038,local_1038);
          iVar7 = access((char *)local_3038,0);
          if (iVar7 == 0) {
LAB_00220f30:
            bVar18 = true;
            bVar2 = true;
            goto LAB_00220d04;
          }
          if (iVar4 == 0) {
            os_build_full_path((char *)local_3038,0x1000,(char *)local_2038,(char *)pbVar12);
            iVar7 = access((char *)local_3038,0);
            if (iVar7 == 0) goto LAB_00220f30;
          }
          pCVar16 = pCVar16->parent_;
        } while (pCVar16 != (CTcTokStream *)0x0);
      }
      ptVar15 = this->incpath_head_;
      if (ptVar15 != (tctok_incpath_t *)0x0) {
        bVar18 = true;
        do {
          os_build_full_path((char *)local_3038,0x1000,ptVar15->path,local_1038);
          iVar7 = access((char *)local_3038,0);
          bVar2 = true;
          if (iVar7 == 0) goto LAB_00220d04;
          if (iVar4 == 0) {
            os_build_full_path((char *)local_3038,0x1000,ptVar15->path,(char *)pbVar12);
            iVar7 = access((char *)local_3038,0);
            if (iVar7 == 0) goto LAB_00220d04;
          }
          ptVar15 = ptVar15->nxt;
        } while (ptVar15 != (tctok_incpath_t *)0x0);
      }
      bVar2 = false;
      bVar18 = false;
LAB_00220d04:
      if (iVar4 != 0 && !bVar2) {
        strcpy((char *)local_3038,(char *)pbVar12);
        iVar4 = access((char *)local_3038,0);
        bVar18 = iVar4 == 0;
      }
      (this->linebuf_).buf_len_ = 0;
      if ((this->linebuf_).buf_size_ != 0) {
        *(this->linebuf_).buf_ = '\0';
      }
      (this->p_).p_ = (this->linebuf_).buf_;
      if (bVar18) {
        ptVar17 = (tctok_incfile_t *)&this->prev_includes_;
        do {
          ptVar17 = ptVar17->nxt;
          if (ptVar17 == (tctok_incfile_t *)0x0) goto LAB_00220e06;
          iVar4 = os_file_names_equal((char *)local_3038,ptVar17->fname);
        } while (iVar4 == 0);
        if (ptVar17 != (tctok_incfile_t *)0x0) {
          if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x2) ==
              (undefined1  [3440])0x0) {
            return;
          }
          sVar8 = strlen((char *)local_3038);
          log_warning(0x2717,sVar8 & 0xffffffff,local_3038);
          return;
        }
LAB_00220e06:
        pCVar9 = CTcSrcFile::open_source
                           ((char *)local_3038,this->res_loader_,this->default_charset_,
                            (int *)local_2038,&local_303c);
        if (pCVar9 != (CTcSrcFile *)0x0) {
          sVar8 = strlen((char *)local_3038);
          orig_fname_len = strlen((char *)pbVar12);
          pCVar10 = get_file_desc(this,(char *)local_3038,sVar8,0,(char *)pbVar12,orig_fname_len);
          this->str_->newline_spacing_ = this->string_newline_spacing_;
          pCVar11 = (CTcTokStream *)operator_new(0x30);
          pCVar16 = this->str_;
          iVar4 = this->if_sp_;
          pCVar11->src_ = &pCVar9->super_CTcSrcObject;
          pCVar11->desc_ = pCVar10;
          pCVar11->parent_ = pCVar16;
          pCVar11->next_linenum_ = 1;
          pCVar11->field_0x28 = pCVar11->field_0x28 & 0xfc | local_2038[0] & 1;
          pCVar11->init_if_level_ = iVar4;
          this->str_ = pCVar11;
          if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x1) !=
              (undefined1  [3440])0x0) {
            add_include_once(this,(char *)local_3038);
          }
          if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x10) ==
              (undefined1  [3440])0x0) {
            return;
          }
          CTcHostIfc::print_msg(G_hostifc,"#include %s\n",local_3038);
          return;
        }
        if (local_303c != 0) {
          log_error(0x2748,this->default_charset_);
          return;
        }
        pbVar12 = local_3038;
      }
      sVar8 = strlen((char *)pbVar12);
      log_error(0x2716,sVar8 & 0xffffffff,pbVar12);
      return;
    }
  }
  else {
    wVar6 = utf8_ptr::s_getch((this->p_).p_);
    wVar5 = L'>';
    if (wVar6 == L'<') goto LAB_00220a94;
  }
  log_error(0x2715);
LAB_00220dc7:
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
}

Assistant:

void CTcTokenizer::pp_include()
{
    wchar_t match;
    int is_local;
    int is_absolute;
    utf8_ptr fname;
    CTcSrcFile *new_src;
    int charset_error;
    int default_charset_error;
    char full_name[OSFNMAX];
    char lcl_name[OSFNMAX];
    int found;
    CTcTokFileDesc *desc;
    int expand;
    utf8_ptr start;

    /* presume we'll expand macros */
    expand = TRUE;

    /*
     *   Check to see if expansion is needed.  Macro expansion is needed
     *   only if the source line is not of one of the following forms:
     *   
     *.  #include "filename"
     *.  #include <filename> 
     */
    for (start = p_ ; is_space(p_.getch()) ; p_.inc()) ;
    switch(p_.getch())
    {
    case '<':
        /* look for a matching '>' */
        match = '>';
        goto find_match;

    case '"':
        /* look for a matching '"' */
        match = '"';
        goto find_match;

    find_match:
        /* find the matching character */
        for (p_.inc() ; p_.getch() != '\0' && p_.getch() != match ;
             p_.inc()) ;

        /* if we found it, check for other characters on the line */
        if (p_.getch() == match)
        {
            /* skip the matching character */
            p_.inc();

            /* skip whitespace */
            while (is_space(p_.getch()))
                p_.inc();

            /* 
             *   make sure there's nothing else on the line - if not, it's
             *   one of the approved formats, so there's no need to do
             *   macro expansion 
             */
            if (p_.getch() == 0)
                expand = FALSE;
        }
        break;
    }

    /* go back to read from the original starting point */
    p_ = start;
    
    /* expand macros if necessary */
    if (expand)
    {
        /* do the expansion */
        if (expand_macros_curline(FALSE, FALSE, FALSE))
        {
            /* clear the buffer and abort */
            clear_linebuf();
            return;
        }

        /* 
         *   remove any expansion flags, so that we don't have to worry about
         *   parsing or skipping them
         */
        remove_expansion_flags(&expbuf_);

        /* read from the expansion buffer */
        start_new_line(&expbuf_, 0);
    }

    /* skip leading whitespace */
    for ( ; is_space(p_.getch()) ; p_.inc()) ;

    /* we have to be looking at at '"' or '<' character */
    if (p_.getch() == '"')
    {
        /* look for a matching quote, and look for a local file */
        match = '"';
        is_local = TRUE;
    }
    else if (p_.getch() == '<')
    {
        /* look for a matching angle bracket, and look for a system file */
        match = '>';
        is_local = FALSE;
    }
    else
    {
        /* invalid syntax - log an error and ignore the line */
        log_error(TCERR_BAD_INC_SYNTAX);
        clear_linebuf();
        return;
    }

    /* skip the open quote, and remember where the filename starts */
    p_.inc();
    fname = p_;

    /* find the matching quote */
    for ( ; p_.getch() != '\0' && p_.getch() != match ; p_.inc()) ;

    /* if we didn't find the match, log an error and ignore the line */
    if (p_.getch() == '\0')
    {
        log_error(TCERR_BAD_INC_SYNTAX);
        clear_linebuf();
        return;
    }
    else
    {
        /*   
         *   We found the close quote.  Before we parse the filename, make
         *   one last check: if there's anything further on the line apart
         *   from whitespace, it's extraneous, so issue a warning.  
         */

        /* remember where the close quote is */
        utf8_ptr closep = p_;
        
        /* skip it, and then skip any trailing whitespace */
        for (p_.inc() ; is_space(p_.getch()) ; p_.inc()) ;

        /* if we're not at the end of the line, issue a warning */
        if (p_.getch() != '\0')
            log_warning(TCERR_EXTRA_INC_SYNTAX);

        /* 
         *   Null-terminate the filename.  (We know there's nothing else
         *   interesting in the buffer after the filename at this point, so
         *   we don't care about overwriting the quote or anything that might
         *   come after it.)  
         */
        closep.setch('\0');
    }

    /* check to see if the filename is absolute */
    is_absolute = os_is_file_absolute(fname.getptr());

    /* we have yet to find the file */
    found = FALSE;

    /* 
     *   in case the name is in portable URL notation, convert from URL
     *   notation to local notation; we'll consider this form of the name
     *   first, and only if we can't find it in this form will we try
     *   treating the name as using local filename conventions 
     */
    os_cvt_url_dir(lcl_name, sizeof(lcl_name), fname.getptr());

    /*
     *   Search for the included file.
     *   
     *   First, if it's a local file (in quotes rather than angle
     *   brackets), start the search in the directory containing the
     *   current file, then look in the directory containing the parent
     *   file, and so on.  If we fail to find it, proceed as for a
     *   non-local file.
     */
    if (is_local && last_desc_ != 0)
    {
        CTcTokStream *cur_str;
        char pathbuf[OSFNMAX];
        
        /* start with the current file, and search parents */
        for (cur_str = str_ ; cur_str != 0 ; cur_str = cur_str->get_parent())
        {
            /* get the path to the current file */
            os_get_path_name(pathbuf, sizeof(pathbuf),
                             last_desc_->get_fname());

            /* 
             *   try the URL-converted name first - this takes precedence
             *   over a local interpretation of the name 
             */
            os_build_full_path(full_name, sizeof(full_name),
                               pathbuf, lcl_name);
            if (!osfacc(full_name))
            {
                found = TRUE;
                break;
            }

            /* if it's a relative local name, try again with local naming */
            if (!is_absolute)
            {
                /* 
                 *   build the full filename, treating the name as using
                 *   local system conventions 
                 */
                os_build_full_path(full_name, sizeof(full_name),
                                   pathbuf, fname.getptr());
                
                /* if we found it, so note and stop searching */
                if (!osfacc(full_name))
                {
                    found = TRUE;
                    break;
                }
            }
        }
    }

    /*
     *   If we still haven't found the file (or if it's a non-local file,
     *   in angle brackets), search the include path.
     */
    if (!found)
    {
        tctok_incpath_t *inc_path;
        
        /* scan the include path */
        for (inc_path = incpath_head_ ; inc_path != 0 ;
             inc_path = inc_path->nxt)
        {
            /* try the URL-converted local name first */
            os_build_full_path(full_name, sizeof(full_name),
                               inc_path->path, lcl_name);
            if (!osfacc(full_name))
            {
                found = TRUE;
                break;
            }

            /* try with the local name, if it's a relative local name */
            if (!is_absolute)
            {
                /* build the full name for the file in this directory */
                os_build_full_path(full_name, sizeof(full_name),
                                   inc_path->path, fname.getptr());
                
                /* if we found it, stop searching */
                if (!osfacc(full_name))
                {
                    found = TRUE;
                    break;
                }
            }
        }
    }

    /* 
     *   If the filename specified an absolute path, and we didn't find a
     *   file with any of the local interpretations, look at the absolute
     *   path.  Note that our portable URL-style notation doesn't allow
     *   absolute notation, so we use only the exact name as specified in
     *   the #include directive as the absolute form.  
     */
    if (is_absolute && !found)
    {
        /* use the original filename as the full name */
        strcpy(full_name, fname.getptr());

        /* try finding the file */
        found = !osfacc(full_name);
    }

    /* 
     *   we have our copy of the filename now; we don't want to retain
     *   this directive in the preprocessed source, so clear out the line
     *   buffer now 
     */
    clear_linebuf();

    /* 
     *   if we didn't find the file anywhere, show an error and ignore the
     *   #include directive 
     */
    if (!found)
    {
        log_error(TCERR_INC_NOT_FOUND,
                  (int)strlen(fname.getptr()), fname.getptr());
        return;
    }
    
    /*
     *   Check the list of included files that are marked for inclusion
     *   only once.  If we've already included this file, ignore this
     *   redundant inclusion.  Check based on the full filename that we
     *   resolved from the search path.  
     */
    if (find_include_once(full_name))
    {
        /* log an error if appropriate */
        if (warn_on_ignore_incl_)
            log_warning(TCERR_REDUNDANT_INCLUDE,
                        (int)strlen(full_name), full_name);
        
        /* ignore this #include directive */
        return;
    }

    /* open a file source to read the file */
    new_src = CTcSrcFile::open_source(full_name, res_loader_,
                                      default_charset_, &charset_error,
                                      &default_charset_error);

    /* if we couldn't open the file, log an error and ignore the line */
    if (new_src == 0)
    {
        /* 
         *   if the error was due to the default character set, log that
         *   problem; otherwise, log the general file-open problem 
         */
        if (default_charset_error)
            log_error(TCERR_CANT_LOAD_DEFAULT_CHARSET, default_charset_);
        else
            log_error(TCERR_INC_NOT_FOUND,
                      (int)strlen(full_name), full_name);

        /* we can go no further */
        return;
    }

    /* get the descriptor for the source file */
    desc = get_file_desc(full_name, strlen(full_name), FALSE,
                         fname.getptr(),
                         fname.getptr() != 0 ? strlen(fname.getptr()) : 0);

    /* 
     *   remember the current #pragma newline_spacing mode, so we can restore
     *   it when we reinstate the current stream 
     */
    str_->set_newline_spacing(string_newline_spacing_);

    /* 
     *   Create and install the new file reader stream object.  By
     *   installing it as the current reader, we'll activate it so that
     *   the next line read will come from the new stream.  Note that the
     *   current stream becomes the parent of the new stream, so that we
     *   revert to the current stream when the new stream is exhausted;
     *   this will allow us to pick up reading from the current stream at
     *   the next line after the #include directive when we've finished
     *   including the new file.  
     */
    str_ = new CTcTokStream(desc, new_src, str_, charset_error, if_sp_);

    /*
     *   If we're in ALL_ONCE mode, it means that every single file we
     *   include should be included only once. 
     */
    if (all_once_)
        add_include_once(full_name);

    /* 
     *   if we're in list-includes mode, write the name of the include file
     *   to the standard output 
     */
    if (list_includes_mode_)
        G_hostifc->print_msg("#include %s\n", full_name);
}